

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::to_composite_constructor_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id,bool uses_buffer_offset)

{
  bool bVar1;
  byte bVar2;
  SPIRType *type;
  string local_48;
  
  type = Compiler::expression_type(&this->super_Compiler,id);
  if ((type->array).super_VectorView<unsigned_int>.buffer_size != 0) {
    bVar1 = (this->backend).array_is_value_type;
    bVar2 = (this->backend).buffer_offset_array_is_value_type;
    if (!uses_buffer_offset) {
      bVar2 = bVar1;
    }
    if ((bVar1 & bVar2) == 0) {
      to_enclosed_expression_abi_cxx11_(&local_48,this,id,true);
      to_rerolled_array_expression(__return_storage_ptr__,this,&local_48,type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_48._M_dataplus._M_p);
      return __return_storage_ptr__;
    }
  }
  to_unpacked_expression_abi_cxx11_(__return_storage_ptr__,this,id,true);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_composite_constructor_expression(uint32_t id, bool uses_buffer_offset)
{
	auto &type = expression_type(id);

	bool reroll_array = !type.array.empty() && (!backend.array_is_value_type ||
	                                            (uses_buffer_offset && !backend.buffer_offset_array_is_value_type));

	if (reroll_array)
	{
		// For this case, we need to "re-roll" an array initializer from a temporary.
		// We cannot simply pass the array directly, since it decays to a pointer and it cannot
		// participate in a struct initializer. E.g.
		// float arr[2] = { 1.0, 2.0 };
		// Foo foo = { arr }; must be transformed to
		// Foo foo = { { arr[0], arr[1] } };
		// The array sizes cannot be deduced from specialization constants since we cannot use any loops.

		// We're only triggering one read of the array expression, but this is fine since arrays have to be declared
		// as temporaries anyways.
		return to_rerolled_array_expression(to_enclosed_expression(id), type);
	}
	else
		return to_unpacked_expression(id);
}